

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTAudioEngine_GetRendererDetails
                   (FACTAudioEngine *pEngine,uint16_t nRendererIndex,
                   FACTRendererDetails *pRendererDetails)

{
  long in_RDX;
  FAudioDeviceDetails deviceDetails;
  undefined1 local_444 [60];
  FAudioDeviceDetails *in_stack_fffffffffffffbf8;
  uint32_t in_stack_fffffffffffffc00;
  undefined1 auStack_244 [512];
  uint local_44;
  long local_18;
  
  local_18 = in_RDX;
  FAudio_PlatformLockMutex((FAudioMutex)0x1106b6);
  FAudio_PlatformGetDeviceDetails(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  SDL_memcpy(local_18,local_444,0x1fe);
  SDL_memcpy(local_18 + 0x1fe,auStack_244,0x1fe);
  *(uint *)(local_18 + 0x3fc) = (uint)((local_44 & 0xf) != 0);
  FAudio_PlatformUnlockMutex((FAudioMutex)0x11073b);
  return 0;
}

Assistant:

uint32_t FACTAudioEngine_GetRendererDetails(
	FACTAudioEngine *pEngine,
	uint16_t nRendererIndex,
	FACTRendererDetails *pRendererDetails
) {
	FAudioDeviceDetails deviceDetails;

	FAudio_PlatformLockMutex(pEngine->apiLock);

	FAudio_PlatformGetDeviceDetails(
		nRendererIndex,
		&deviceDetails
	);
	FAudio_memcpy(
		pRendererDetails->rendererID,
		deviceDetails.DeviceID,
		sizeof(int16_t) * 0xFF
	);
	FAudio_memcpy(
		pRendererDetails->displayName,
		deviceDetails.DisplayName,
		sizeof(int16_t) * 0xFF
	);
	/* FIXME: Which defaults does it care about...? */
	pRendererDetails->defaultDevice = (deviceDetails.Role & (
		FAudioGlobalDefaultDevice |
		FAudioDefaultGameDevice
	)) != 0;

	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return 0;
}